

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rock_sample.cpp
# Opt level: O3

void __thiscall despot::RockSample::ObsProb(RockSample *this)

{
  ACT_TYPE in_ECX;
  State *in_RDX;
  OBS_TYPE in_RSI;
  
  ObsProb((RockSample *)
          &this[-1].super_BaseRockSample.transition_probabilities_.
           super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_RDX,in_ECX);
  return;
}

Assistant:

double RockSample::ObsProb(OBS_TYPE obs, const State& state, ACT_TYPE action) const {
	if (action <= E_SAMPLE)
		return obs == E_NONE;

	if (obs != E_GOOD && obs != E_BAD)
		return 0;

	const RockSampleState& rockstate =
		static_cast<const RockSampleState&>(state);

	int rock = action - E_SAMPLE - 1;
	double distance = Coord::EuclideanDistance(GetRobPos(&rockstate),
		rock_pos_[rock]);
	double efficiency = (1 + pow(2, -distance / half_efficiency_distance_))
		* 0.5;

	return
		((GetRock(&rockstate, rock) & 1) == obs) ? efficiency : (1 - efficiency);
}